

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

MI<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::SelfReduce(MI<8UL,_GF2::MOGrevlex<8UL>_> *this)

{
  bool bVar1;
  size_t sVar2;
  MI<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  MI<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_00000010;
  iterator in_stack_00000018;
  iterator pos;
  bool changed;
  MI<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_00000098;
  iterator in_stack_000000a0;
  list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  _Self local_20;
  _Self local_18;
  byte local_9;
  
  do {
    local_9 = 0;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ::begin(in_stack_ffffffffffffffa8);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator--(&local_18);
      bVar1 = Reduce(in_stack_00000098,in_stack_000000a0);
      if (bVar1) {
        local_9 = 1;
        in_stack_ffffffffffffffa8 =
             (list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              *)Size((MI<8UL,_GF2::MOGrevlex<8UL>_> *)0x1ce7b7);
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1ce7c5);
        sVar2 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Size((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1ce7cd);
        Env::Trace("SelfReduce: %zu polys (%zu mons)",in_stack_ffffffffffffffa8,sVar2);
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                  ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1ce7ec);
        bVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator==
                          ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffffc0._M_node,
                           SUB81((ulong)in_stack_ffffffffffffffb8._M_node >> 0x38,0));
        if (bVar1) {
          local_18._M_node = (_List_node_base *)RemoveAt(in_RDI,in_stack_ffffffffffffffb8);
        }
        else {
          in_stack_ffffffffffffffc0 =
               std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(&local_18,0);
          in_stack_ffffffffffffffb8 = Move(in_stack_00000010,in_stack_00000018);
        }
      }
    }
  } while ((local_9 & 1) != 0);
  return in_RDI;
}

Assistant:

MI& SelfReduce()
	{	
		// важно, чтобы система была нормализована
		assert(IsNormalized());
		// цикл замены на нормальные формы
		bool changed;
		do
		{
			changed = false;
			// двигаемся от старших многочленов к младшим
			for (iterator pos = end(); pos != begin();)
				// есть изменения?
				if (Reduce(--pos))
				{
					changed = true;
					Env::Trace("SelfReduce: %zu polys (%zu mons)", 
						Size(), pos->Size());
					// нулевая форма? исключаем
					if (*pos == 0)
						pos = RemoveAt(pos);
					// ненулевая? перемещаем
					else
						Move(pos++);
				}
		}
		while (changed);
		return *this;
	}